

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_register_allocation.cpp
# Opt level: O3

Module * mocker::allocateRegistersNaively(Module *__return_storage_ptr__,Module *module)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>_>
  *this;
  long lVar1;
  long *plVar2;
  element_type *peVar3;
  undefined8 *puVar4;
  list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *__position;
  pointer psVar5;
  int iVar6;
  iterator iVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  _List_node_base *p_Var10;
  long *plVar11;
  long lVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__k;
  long *plVar13;
  vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
  funcBegs;
  RegMap<std::size_t> offsets;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_200;
  Module *local_1e8;
  OpType local_1dc;
  long *local_1d8;
  long lStack_1d0;
  long local_1c8;
  undefined1 local_1c0 [32];
  float local_1a0;
  size_t local_198;
  undefined1 auStack_190 [8];
  undefined1 local_188 [32];
  _List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> local_168;
  key_type local_150;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_130;
  long *local_128;
  long *local_120;
  long *local_118;
  _List_node_base *local_110;
  undefined8 local_108;
  _List_node_base local_100;
  Line local_f0;
  Line local_c0;
  Line local_90;
  Line local_60;
  
  nasm::Module::Module(__return_storage_ptr__,module);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,".text","");
  this = &__return_storage_ptr__->sections;
  local_1e8 = __return_storage_ptr__;
  iVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this->_M_h,&local_150);
  if (iVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
      ._M_cur == (__node_type *)0x0) {
LAB_00126ebd:
    std::__throw_out_of_range("_Map_base::at");
  }
  local_110 = &local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,
             *(long *)((long)iVar7.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                             ._M_cur + 0x28),
             *(long *)((long)iVar7.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                             ._M_cur + 0x30) +
             *(long *)((long)iVar7.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                             ._M_cur + 0x28));
  local_188._0_8_ = local_188 + 0x10;
  if (local_110 == &local_100) {
    local_188._24_8_ = local_100._M_prev;
  }
  else {
    local_188._0_8_ = local_110;
  }
  local_188._17_7_ = local_100._M_next._1_7_;
  local_188[0x10] = local_100._M_next._0_1_;
  local_168._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)(local_188 + 0x20);
  local_188._8_8_ = local_108;
  local_108 = 0;
  local_100._M_next._0_1_ = 0;
  local_168._M_impl._M_node._M_size = 0;
  local_1c8 = 0;
  local_1d8 = (long *)0x0;
  lStack_1d0 = 0;
  p_Var10 = (_List_node_base *)
            ((long)iVar7.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                   ._M_cur + 0x48);
  local_1c0._0_8_ =
       *(long *)((long)iVar7.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                       ._M_cur + 0x48);
  local_168._M_impl._M_node.super__List_node_base._M_prev =
       local_168._M_impl._M_node.super__List_node_base._M_next;
  local_130 = &this->_M_h;
  local_110 = &local_100;
  if ((_List_node_base *)local_1c0._0_8_ != p_Var10) {
    do {
      if (((_List_node_base *)(local_1c0._0_8_ + 0x30))->_M_next == (_List_node_base *)0x0) {
        if (((_List_node_base *)(local_1c0._0_8_ + 0x10))->_M_prev == (_List_node_base *)0x0) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0,0);
          goto LAB_00126ebd;
        }
        if (*(char *)&((_List_node_base *)(local_1c0._0_8_ + 0x10))->_M_next->_M_next != '.') {
          std::
          vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
          ::emplace_back<std::_List_const_iterator<mocker::nasm::Line>&>
                    ((vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
                      *)&local_1d8,(_List_const_iterator<mocker::nasm::Line> *)local_1c0);
        }
      }
      local_1c0._0_8_ = ((_List_node_base *)local_1c0._0_8_)->_M_next;
    } while ((_List_node_base *)local_1c0._0_8_ != p_Var10);
  }
  local_1c0._0_8_ = p_Var10;
  std::
  vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
  ::emplace_back<std::_List_const_iterator<mocker::nasm::Line>>
            ((vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
              *)&local_1d8,(_List_const_iterator<mocker::nasm::Line> *)local_1c0);
  local_128 = (long *)(lStack_1d0 + -8);
  if (local_1d8 != local_128) {
    plVar11 = local_1d8;
    do {
      plVar13 = (long *)*plVar11;
      plVar2 = (long *)plVar11[1];
      local_1c0._0_8_ = auStack_190;
      local_1c0._8_8_ = 1;
      local_1c0._16_8_ = (_Hash_node_base *)0x0;
      local_1c0._24_8_ = 0;
      local_1a0 = 1.0;
      local_198 = 0;
      auStack_190 = (undefined1  [8])0x0;
      local_118 = plVar11;
      if (plVar13 == plVar2) {
        lVar12 = 0x10;
      }
      else {
        lVar12 = 0;
        local_120 = plVar13;
        do {
          if (plVar13[6] != 0) {
            nasm::getInvolvedRegs(&local_200,(shared_ptr<mocker::nasm::Inst> *)(plVar13 + 6));
            psVar5 = local_200.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (__k = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_200.
                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                __k != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar5; __k = __k + 1) {
              peVar3 = ((__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                       &__k->_vptr__Sp_counted_base)->_M_ptr;
              if ((peVar3->identifier)._M_string_length == 0) {
                std::__throw_out_of_range_fmt
                          ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0,0
                          );
                goto LAB_00126e6d;
              }
              if ((*(peVar3->identifier)._M_dataplus._M_p == 'v') &&
                 (iVar8 = std::
                          _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          ::find((_Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                  *)local_1c0,(key_type *)__k),
                 iVar8.
                 super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_true>
                 ._M_cur == (__node_type *)0x0)) {
                pmVar9 = std::__detail::
                         _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)local_1c0,(key_type *)__k);
                lVar1 = lVar12 * 8;
                lVar12 = lVar12 + 1;
                *pmVar9 = lVar1 + 8;
              }
            }
            std::
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::~vector(&local_200);
          }
          plVar13 = (long *)*plVar13;
        } while (plVar13 != plVar2);
        lVar12 = (local_1c0._24_8_ & 0xfffffffffffffffe) * 8 + 0x10;
        plVar13 = local_120;
      }
      __position = (list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)
                   (local_188 + 0x20);
      local_60.label._M_dataplus._M_p = (pointer)&local_60.label.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,plVar13[2],plVar13[3] + plVar13[2]);
      local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)plVar13[6];
      local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar13[7];
      if (local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
      _M_insert<mocker::nasm::Line>(__position,(iterator)__position,&local_60);
      if (local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.label._M_dataplus._M_p != &local_60.label.field_2) {
        operator_delete(local_60.label._M_dataplus._M_p,
                        local_60.label.field_2._M_allocated_capacity + 1);
      }
      puVar4 = (undefined8 *)*plVar13;
      nasm::dyc<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Inst>const&>
                ((nasm *)&local_200,(shared_ptr<mocker::nasm::Inst> *)(puVar4 + 6));
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_200.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00126e6d:
        __assert_fail("nasm::dyc<nasm::Push>(lineIter->inst)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                      ,0xf8,
                      "void mocker::(anonymous namespace)::allocate(LineIter, LineIter, nasm::Section &)"
                     );
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_200.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_200.
                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_90.label._M_dataplus._M_p = (pointer)&local_90.label.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,puVar4[2],puVar4[3] + puVar4[2])
      ;
      local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)puVar4[6];
      local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar4[7];
      if (local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
      _M_insert<mocker::nasm::Line>(__position,(iterator)__position,&local_90);
      if (local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.label._M_dataplus._M_p != &local_90.label.field_2) {
        operator_delete(local_90.label._M_dataplus._M_p,
                        local_90.label.field_2._M_allocated_capacity + 1);
      }
      puVar4 = (undefined8 *)*puVar4;
      nasm::dyc<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Inst>const&>
                ((nasm *)&local_200,(shared_ptr<mocker::nasm::Inst> *)(puVar4 + 6));
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_200.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        __assert_fail("nasm::dyc<nasm::Mov>(lineIter->inst)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                      ,0xfb,
                      "void mocker::(anonymous namespace)::allocate(LineIter, LineIter, nasm::Section &)"
                     );
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_200.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_200.
                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_c0.label._M_dataplus._M_p = (pointer)&local_c0.label.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_c0,puVar4[2],puVar4[3] + puVar4[2])
      ;
      local_c0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)puVar4[6];
      local_c0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar4[7];
      if (local_c0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_c0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_c0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_c0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_c0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
      _M_insert<mocker::nasm::Line>(__position,(iterator)__position,&local_c0);
      if (local_c0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.label._M_dataplus._M_p != &local_c0.label.field_2) {
        operator_delete(local_c0.label._M_dataplus._M_p,
                        local_c0.label.field_2._M_allocated_capacity + 1);
      }
      plVar11 = (long *)*puVar4;
      if (lVar12 != 0) {
        local_1dc = Sub;
        if ((nasm::rsp()::res == '\0') &&
           (iVar6 = __cxa_guard_acquire(&nasm::rsp()::res), iVar6 != 0)) {
          nasm::rsp::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                    (&nasm::rsp::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Register **)&nasm::rsp::res,
                     (allocator<mocker::nasm::Register> *)&local_200,(char (*) [4])"rsp");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&nasm::rsp::res,&__dso_handle);
          __cxa_guard_release(&nasm::rsp()::res);
        }
        local_200.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)operator_new(0x20);
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_200.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count = 1;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_200.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->_M_weak_count = 1;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_200.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->_vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_001e9070;
        local_200.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_200.
                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1);
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_200.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)[1]._vptr__Sp_counted_base =
             (_func_int **)&PTR__Addr_001e90c0;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_200.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)[1]._M_use_count = (int)lVar12;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_200.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)[1]._M_weak_count = (int)((ulong)lVar12 >> 0x20);
        nasm::Section::
        emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>>
                  ((Section *)(auStack_190 + 8),&local_1dc,&nasm::rsp::res,
                   (shared_ptr<mocker::nasm::NumericConstant> *)&local_200);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_200.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_200.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
      }
      for (; plVar11 != plVar2; plVar11 = (long *)*plVar11) {
        if (plVar11[6] == 0) {
          local_f0.label._M_dataplus._M_p = (pointer)&local_f0.label.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,plVar11[2],plVar11[3] + plVar11[2]);
          local_f0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)plVar11[6];
          local_f0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[7];
          if (local_f0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_f0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_f0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_f0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_f0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
          _M_insert<mocker::nasm::Line>
                    ((list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)
                     (local_188 + 0x20),(iterator)(local_188 + 0x20),&local_f0);
          if (local_f0.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_f0.inst.
                       super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0.label._M_dataplus._M_p != &local_f0.label.field_2) {
            operator_delete(local_f0.label._M_dataplus._M_p,
                            local_f0.label.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          anon_unknown_1::allocate
                    ((shared_ptr<mocker::nasm::Inst> *)(plVar11 + 6),
                     (RegMap<std::size_t> *)local_1c0,(Section *)(auStack_190 + 8));
        }
      }
      plVar11 = local_118 + 1;
      std::
      _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_1c0);
    } while (plVar11 != local_128);
  }
  if (local_1d8 != (long *)0x0) {
    operator_delete(local_1d8,local_1c8 - (long)local_1d8);
  }
  local_1c0._0_8_ = (_List_node_base *)(local_1c0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,".text","");
  iVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(local_130,(key_type *)local_1c0);
  if (iVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  std::__cxx11::string::operator=
            ((string *)
             ((long)iVar7.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                    ._M_cur + 0x28),(string *)(auStack_190 + 8));
  std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::_M_move_assign
            ((list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)
             ((long)iVar7.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                    ._M_cur + 0x48),
             (_List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)
             (local_188 + 0x20));
  if ((_List_node_base *)local_1c0._0_8_ != (_List_node_base *)(local_1c0 + 0x10)) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1c0._16_8_ + 1));
  }
  std::__cxx11::_List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::_M_clear
            ((_List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)
             (local_188 + 0x20));
  if ((_List_node_base *)local_188._0_8_ != (_List_node_base *)(local_188 + 0x10)) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  return local_1e8;
}

Assistant:

nasm::Module allocateRegistersNaively(const nasm::Module &module) {
  nasm::Module res(module);
  res.getSection(".text") = allocate(res.getSection(".text"));
  return res;
}